

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeCommandListGetNextCommandIdWithKernelsExpPrologue
          (ZEParameterValidation *this,ze_command_list_handle_t hCommandList,
          ze_mutable_command_id_exp_desc_t *desc,uint32_t numKernels,ze_kernel_handle_t *phKernels,
          uint64_t *pCommandId)

{
  uint64_t *pCommandId_local;
  ze_kernel_handle_t *phKernels_local;
  uint32_t numKernels_local;
  ze_mutable_command_id_exp_desc_t *desc_local;
  ze_command_list_handle_t hCommandList_local;
  ZEParameterValidation *this_local;
  
  if (hCommandList == (ze_command_list_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (desc == (ze_mutable_command_id_exp_desc_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pCommandId == (uint64_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (desc->flags < 0x100) {
    this_local._4_4_ =
         ParameterValidation::validateExtensions<_ze_mutable_command_id_exp_desc_t_const*>(desc);
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeCommandListGetNextCommandIdWithKernelsExpPrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        const ze_mutable_command_id_exp_desc_t* desc,   ///< [in][out] pointer to mutable command identifier descriptor
        uint32_t numKernels,                            ///< [in][optional] number of entries on phKernels list
        ze_kernel_handle_t* phKernels,                  ///< [in][optional][range(0, numKernels)] list of kernels that user can
                                                        ///< switch between using ::zeCommandListUpdateMutableCommandKernelsExp
                                                        ///< call
        uint64_t* pCommandId                            ///< [out] pointer to mutable command identifier to be written
        )
    {
        if( nullptr == hCommandList )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pCommandId )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0xff < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }